

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabbar.cpp
# Opt level: O3

int __thiscall QTabBarPrivate::init(QTabBarPrivate *this,EVP_PKEY_CTX *ctx)

{
  QWidget *parent;
  void **ppvVar1;
  QWidget *pQVar2;
  TextElideMode TVar3;
  int iVar4;
  QToolButton *pQVar5;
  undefined4 *puVar6;
  QStyle *pQVar7;
  long in_FS_OFFSET;
  Connection local_70;
  QObject local_68 [8];
  QString local_60;
  code *local_48;
  ImplFn local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  parent = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  pQVar5 = (QToolButton *)operator_new(0x28);
  QToolButton::QToolButton(pQVar5,parent);
  this->leftB = pQVar5;
  local_60.d.d = (Data *)0x0;
  local_60.d.ptr = L"ScrollLeftButton";
  local_60.d.size = 0x10;
  QObject::doSetObjectName((QString *)pQVar5);
  if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,0x10);
    }
  }
  QAbstractButton::setAutoRepeat(&this->leftB->super_QAbstractButton,true);
  pQVar5 = this->leftB;
  local_60.d.d = (Data *)QAbstractButton::clicked;
  local_60.d.ptr = (char16_t *)0x0;
  local_48 = scrollTabs;
  local_40 = (ImplFn)0x0;
  ppvVar1 = *(void ***)&(this->super_QWidgetPrivate).field_0x8;
  puVar6 = (undefined4 *)operator_new(0x20);
  *puVar6 = 1;
  *(code **)(puVar6 + 2) =
       QtPrivate::QPrivateSlotObject<void_(QTabBarPrivate::*)(),_QtPrivate::List<>,_void>::impl;
  *(code **)(puVar6 + 4) = scrollTabs;
  *(undefined8 *)(puVar6 + 6) = 0;
  QObject::connectImpl
            (local_68,(void **)pQVar5,(QObject *)&local_60,ppvVar1,(QSlotObjectBase *)&local_48,
             (ConnectionType)puVar6,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_68);
  QWidget::hide((QWidget *)this->leftB);
  pQVar5 = (QToolButton *)operator_new(0x28);
  QToolButton::QToolButton(pQVar5,parent);
  this->rightB = pQVar5;
  local_60.d.d = (Data *)0x0;
  local_60.d.ptr = L"ScrollRightButton";
  local_60.d.size = 0x11;
  QObject::doSetObjectName((QString *)pQVar5);
  if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,0x10);
    }
  }
  QAbstractButton::setAutoRepeat(&this->rightB->super_QAbstractButton,true);
  pQVar5 = this->rightB;
  local_60.d.d = (Data *)QAbstractButton::clicked;
  local_60.d.ptr = (char16_t *)0x0;
  local_48 = scrollTabs;
  local_40 = (ImplFn)0x0;
  ppvVar1 = *(void ***)&(this->super_QWidgetPrivate).field_0x8;
  puVar6 = (undefined4 *)operator_new(0x20);
  *puVar6 = 1;
  *(code **)(puVar6 + 2) =
       QtPrivate::QPrivateSlotObject<void_(QTabBarPrivate::*)(),_QtPrivate::List<>,_void>::impl;
  *(code **)(puVar6 + 4) = scrollTabs;
  *(undefined8 *)(puVar6 + 6) = 0;
  QObject::connectImpl
            ((QObject *)&local_70,(void **)pQVar5,(QObject *)&local_60,ppvVar1,
             (QSlotObjectBase *)&local_48,(ConnectionType)puVar6,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection(&local_70);
  QWidget::hide((QWidget *)this->rightB);
  QWidget::setFocusPolicy(parent,TabFocus);
  pQVar2 = (QWidget *)this->leftB;
  QMetaObject::tr((char *)&local_60,(char *)&QTabBar::staticMetaObject,0x6def9a);
  QWidget::setAccessibleName(pQVar2,&local_60);
  if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,0x10);
    }
  }
  pQVar2 = (QWidget *)this->rightB;
  QMetaObject::tr((char *)&local_60,(char *)&QTabBar::staticMetaObject,0x6defa6);
  QWidget::setAccessibleName(pQVar2,&local_60);
  if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,0x10);
    }
  }
  QWidget::setSizePolicy(parent,(QSizePolicy)0x50000);
  pQVar7 = QWidget::style(parent);
  TVar3 = (**(code **)(*(long *)pQVar7 + 0xf0))(pQVar7,0x43,0,parent,0);
  this->elideMode = TVar3;
  pQVar7 = QWidget::style(parent);
  iVar4 = (**(code **)(*(long *)pQVar7 + 0xf0))(pQVar7,0x26,0,parent,0);
  *(ushort *)&this->field_0x2d0 =
       ((ushort)*(undefined4 *)&this->field_0x2d0 & 0xfff7) + (ushort)(iVar4 == 0) * 8;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QTabBarPrivate::init()
{
    Q_Q(QTabBar);
    leftB = new QToolButton(q);
    leftB->setObjectName(u"ScrollLeftButton"_s);
    leftB->setAutoRepeat(true);
    QObjectPrivate::connect(leftB, &QToolButton::clicked,
                            this, &QTabBarPrivate::scrollTabs);
    leftB->hide();
    rightB = new QToolButton(q);
    rightB->setObjectName(u"ScrollRightButton"_s);
    rightB->setAutoRepeat(true);
    QObjectPrivate::connect(rightB, &QToolButton::clicked,
                            this, &QTabBarPrivate::scrollTabs);
    rightB->hide();
#ifdef QT_KEYPAD_NAVIGATION
    if (QApplicationPrivate::keypadNavigationEnabled()) {
        leftB->setFocusPolicy(Qt::NoFocus);
        rightB->setFocusPolicy(Qt::NoFocus);
        q->setFocusPolicy(Qt::NoFocus);
    } else
#endif
        q->setFocusPolicy(Qt::TabFocus);

#if QT_CONFIG(accessibility)
    leftB->setAccessibleName(QTabBar::tr("Scroll Left"));
    rightB->setAccessibleName(QTabBar::tr("Scroll Right"));
#endif
    q->setSizePolicy(QSizePolicy::Preferred, QSizePolicy::Fixed);
    elideMode = Qt::TextElideMode(q->style()->styleHint(QStyle::SH_TabBar_ElideMode, nullptr, q));
    useScrollButtons = !q->style()->styleHint(QStyle::SH_TabBar_PreferNoArrows, nullptr, q);
}